

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

parser_error parse_entry_parameter(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *__s1;
  parser_error pVar3;
  ui_entry_name_parameter *puVar4;
  long lVar5;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(char *)((long)pvVar2 + 0x1c) == '\0') {
    __s1 = parser_getstr(p,"parameter");
    puVar4 = name_parameters;
    pVar3 = PARSE_ERROR_INVALID_VALUE;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      iVar1 = strcmp(__s1,puVar4->name);
      if (iVar1 == 0) {
        *(int *)((long)pvVar2 + 0x10) = (int)lVar5;
        return PARSE_ERROR_NONE;
      }
      puVar4 = puVar4 + 1;
    }
  }
  else {
    pVar3 = PARSE_ERROR_INVALID_OPTION;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_entry_parameter(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;
	int n = N_ELEMENTS(name_parameters);
	int i;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/*
	 * Don't allow parameterization when editing an already existing entry.
	 */
	if (embryo->exists) {
		return PARSE_ERROR_INVALID_OPTION;
	}
	name = parser_getstr(p, "parameter");
	i = 0;
	while (1) {
		if (i >= n) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		if (streq(name, name_parameters[i].name)) {
			embryo->param_index = i;
			break;
		}
		++i;
	}
	return PARSE_ERROR_NONE;
}